

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

DispatchCallResult __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,uint64_t typeId,uint16_t methodId)

{
  char *pcVar1;
  size_t sVar2;
  undefined6 in_register_0000000a;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  DispatchCallResult DVar4;
  unsigned_short *in_stack_fffffffffffffe18;
  undefined1 local_1da [2];
  String local_1d8;
  char *local_1b8;
  uint64_t local_1b0;
  Exception local_1a8;
  
  local_1b8 = (char *)CONCAT62(in_register_0000000a,methodId);
  local_1b0 = typeId;
  kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
            (&local_1d8,(Debug *)"\"Method not implemented.\", interfaceName, typeId, methodId",
             "Method not implemented.",(char (*) [24])&local_1b0,&local_1b8,
             (unsigned_long *)local_1da,in_stack_fffffffffffffe18);
  kj::Exception::Exception
            (&local_1a8,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,100,&local_1d8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)this,&local_1a8);
  *(undefined2 *)&(this->thisHook).ptr = 0x100;
  kj::Exception::~Exception(&local_1a8);
  sVar2 = local_1d8.content.size_;
  pcVar1 = local_1d8.content.ptr;
  uVar3 = extraout_RDX;
  if (local_1d8.content.ptr != (char *)0x0) {
    local_1d8.content.ptr = (char *)0x0;
    local_1d8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1d8.content.disposer)
              (local_1d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    uVar3 = extraout_RDX_00;
  }
  DVar4.isStreaming = (bool)(char)uVar3;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar3 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar3 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

Capability::Server::DispatchCallResult Capability::Server::internalUnimplemented(
    const char* interfaceName, uint64_t typeId, uint16_t methodId) {
  return {
    KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName, typeId, methodId),
    false, true
  };
}